

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::GraphicsTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicsTestInstance *this)

{
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkRenderPass renderPass_00;
  VkCommandBuffer_s *pVVar1;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)17>_> data_03;
  RefData<vk::Handle<(vk::HandleType)23>_> data_04;
  RefData<vk::Handle<(vk::HandleType)16>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  RefData<vk::Handle<(vk::HandleType)18>_> data_08;
  IVec2 IVar2;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 height;
  VkResult result;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  VkImage *pVVar6;
  VkDeviceSize VVar7;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  Handle<(vk::HandleType)21> *pHVar8;
  Handle<(vk::HandleType)19> *pHVar9;
  VkBuffer *pVVar10;
  Handle<(vk::HandleType)22> *pHVar11;
  DescriptorSetUpdateBuilder *this_02;
  Handle<(vk::HandleType)17> *pHVar12;
  Handle<(vk::HandleType)13> *pAttachments;
  Handle<(vk::HandleType)24> *pHVar13;
  GraphicsPipelineBuilder *pGVar14;
  ProgramCollection<vk::ProgramBinary> *pPVar15;
  ProgramBinary *pPVar16;
  Handle<(vk::HandleType)16> *pHVar17;
  VkCommandBuffer_s **ppVVar18;
  Handle<(vk::HandleType)23> *pHVar19;
  Handle<(vk::HandleType)18> *pHVar20;
  TestContext *this_03;
  TestLog *log;
  void *memory;
  allocator<char> local_a61;
  string local_a60;
  undefined4 local_a40;
  allocator<char> local_a39;
  string local_a38;
  VkDeviceMemory local_a18;
  Allocation *local_a10;
  Allocation *resultAlloc;
  undefined1 local_a00 [8];
  VkBufferMemoryBarrier shaderWriteBarrier;
  undefined1 local_980 [8];
  VkImageMemoryBarrier barrierColorAttachmentSetInitialLayout;
  undefined4 uStack_930;
  VkImageSubresourceRange imageFullSubresourceRange;
  VkDeviceSize vertexBufferOffset;
  Vec4 clearColor;
  VkRect2D renderArea;
  Move<vk::Handle<(vk::HandleType)18>_> local_8e8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_8c8;
  undefined1 local_8a8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  string local_880;
  allocator<char> local_859;
  string local_858;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  undefined1 local_7c0 [8];
  GraphicsPipelineBuilder pipelineBuilder;
  Move<vk::VkCommandBuffer_s_*> local_6f0;
  RefData<vk::VkCommandBuffer_s_*> local_6d0;
  undefined1 local_6b0 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_670;
  undefined1 local_650 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)16>_> local_628;
  RefData<vk::Handle<(vk::HandleType)16>_> local_608;
  undefined1 local_5e8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_5c0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_5a0;
  undefined1 local_580 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_540;
  undefined1 local_520 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  VkSpecializationInfo *pSpecInfo;
  Specialization specialization;
  DescriptorSetUpdateBuilder local_498;
  deUint64 local_450;
  undefined1 local_448 [8];
  VkDescriptorBufferInfo descriptorBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_420;
  RefData<vk::Handle<(vk::HandleType)22>_> local_400;
  undefined1 local_3e0 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_3a8;
  RefData<vk::Handle<(vk::HandleType)21>_> local_388;
  undefined1 local_368 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_300;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2e0;
  undefined1 local_2c0 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_298;
  undefined1 local_260 [8];
  Buffer resultBuffer;
  Vector<float,_4> local_228;
  Vector<float,_4> local_218;
  Vector<float,_4> local_208;
  float *local_1f8;
  Vec4 *pVertices;
  Allocation *alloc;
  VkBufferCreateInfo local_1e0;
  undefined1 local_1a8 [8];
  Buffer vertexBuffer;
  VkDeviceSize vertexBufferSizeBytes;
  VkImageAspectFlags VStack_168;
  deUint32 numVertices;
  undefined8 uStack_160;
  deUint32 local_158;
  VkImage local_148;
  Move<vk::Handle<(vk::HandleType)13>_> local_140;
  RefData<vk::Handle<(vk::HandleType)13>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorImageView;
  VkImageCreateInfo local_d8;
  undefined1 local_80 [8];
  Image colorImage;
  VkFormat imageFormat;
  IVec2 renderSize;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  GraphicsTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar4 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  renderSize.m_data = (int  [2])Context::getDefaultAllocator((this->super_TestInstance).m_context);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xffffffffffffffb8,0x20,0x20);
  IVar2.m_data = renderSize.m_data;
  colorImage.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._12_4_ = 0x25;
  makeImageCreateInfo(&local_d8,(Vector<int,_2> *)&stack0xffffffffffffffb8,VK_FORMAT_R8G8B8A8_UNORM,
                      0x10);
  colorImageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._4_4_ =
       ::vk::MemoryRequirement::Any.m_flags;
  pipeline::Image::Image
            ((Image *)local_80,vk_00,device_00,(Allocator *)IVar2.m_data,&local_d8,
             ::vk::MemoryRequirement::Any);
  pVVar6 = pipeline::Image::operator*((Image *)local_80);
  local_148.m_internal = pVVar6->m_internal;
  ::vk::makeImageSubresourceRange((VkImageSubresourceRange *)&stack0xfffffffffffffe98,1,0,1,0,1);
  subresourceRange.levelCount = (deUint32)uStack_160;
  subresourceRange.aspectMask = VStack_168;
  subresourceRange.baseMipLevel = numVertices;
  subresourceRange.baseArrayLayer = SUB84(uStack_160,4);
  subresourceRange.layerCount = local_158;
  makeImageView(&local_140,vk_00,device_00,local_148,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data.deleter.m_deviceIface._0_4_ = (int)local_120.deleter.m_deviceIface;
  data.object.m_internal = local_120.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_120.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_120.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_120.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_120.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_120.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_100,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_140);
  IVar2 = renderSize;
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = 0x30;
  makeBufferCreateInfo(&local_1e0,0x30,0x80);
  alloc._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  pipeline::Buffer::Buffer
            ((Buffer *)local_1a8,vk_00,device_00,(Allocator *)IVar2.m_data,&local_1e0,
             ::vk::MemoryRequirement::HostVisible);
  pVertices = (Vec4 *)pipeline::Buffer::getAllocation((Buffer *)local_1a8);
  local_1f8 = (float *)::vk::Allocation::getHostPtr((Allocation *)pVertices);
  tcu::Vector<float,_4>::Vector(&local_208,-1.0,-1.0,0.0,1.0);
  *(undefined8 *)local_1f8 = local_208.m_data._0_8_;
  *(undefined8 *)(local_1f8 + 2) = local_208.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_218,-1.0,1.0,0.0,1.0);
  *(undefined8 *)(local_1f8 + 4) = local_218.m_data._0_8_;
  *(undefined8 *)(local_1f8 + 6) = local_218.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_228,1.0,-1.0,0.0,1.0);
  *(undefined8 *)(local_1f8 + 8) = local_228.m_data._0_8_;
  *(undefined8 *)(local_1f8 + 10) = local_228.m_data._8_8_;
  resultBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::Allocation::getMemory((Allocation *)pVertices);
  VVar7 = ::vk::Allocation::getOffset((Allocation *)pVertices);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             resultBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,
             VVar7,0x30);
  IVar2 = renderSize;
  makeBufferCreateInfo(&local_298,this->m_ssboSize,0x20);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  pipeline::Buffer::Buffer
            ((Buffer *)local_260,vk_00,device_00,(Allocator *)IVar2.m_data,&local_298,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x1f);
  ::vk::DescriptorSetLayoutBuilder::build(&local_300,this_00,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2e0,(Move *)&local_300);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2e0.deleter.m_deviceIface;
  data_00.object.m_internal = local_2e0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2e0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_2e0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_2e0.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_2e0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2e0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2c0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_300);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_3a8,this_01,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_388,(Move *)&local_3a8);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_388.deleter.m_deviceIface;
  data_01.object.m_internal = local_388.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_388.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_388.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_388.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_388.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_388.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_368,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_3a8);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_368);
  descriptorPool_00.m_internal = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2c0);
  descriptorBufferInfo.range = pHVar9->m_internal;
  makeDescriptorSet(&local_420,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)descriptorBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_400,(Move *)&local_420);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_400.deleter.m_deviceIface;
  data_02.object.m_internal = local_400.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_400.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_400.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_400.deleter.m_device >> 0x20);
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_400.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_400.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3e0,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_420);
  pVVar10 = pipeline::Buffer::get((Buffer *)local_260);
  local_450 = pVVar10->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_448,(VkBuffer)local_450,0,this->m_ssboSize);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_498);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3e0);
  destSet.m_internal = pHVar11->m_internal;
  specialization.m_specialization.pData =
       (void *)::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_498,destSet,(Location *)&specialization.m_specialization.pData,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,(VkDescriptorBufferInfo *)local_448);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_498);
  Specialization::Specialization((Specialization *)&pSpecInfo,&this->m_specConstants);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)Specialization::getSpecializationInfo((Specialization *)&pSpecInfo);
  pipeline::makeRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_540,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_540.deleter.m_deviceIface;
  data_03.object.m_internal = local_540.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_540.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_540.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_540.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_540.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_540.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_520,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_520);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar12->m_internal;
  pAttachments = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::get
                           ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_100);
  dVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  makeFramebuffer(&local_5c0,vk_00,device_00,
                  (VkRenderPass)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,1,pAttachments,dVar5,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5a0,(Move *)&local_5c0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_5a0.deleter.m_deviceIface;
  data_04.object.m_internal = local_5a0.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5a0.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_5a0.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_5a0.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_5a0.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_5a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_580,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_5c0);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2c0);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar9->m_internal;
  makePipelineLayout(&local_628,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_608,(Move *)&local_628);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_608.deleter.m_deviceIface;
  data_05.object.m_internal = local_608.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_608.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_608.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_608.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_608.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_608.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_5e8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_628);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,device_00
             ,2,dVar4,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_670,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_670.deleter.m_deviceIface;
  data_06.object.m_internal = local_670.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_670.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_670.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_670.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_670.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_670.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_650,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_650);
  pipelineBuilder._192_8_ = pHVar13->m_internal;
  makeCommandBuffer(&local_6f0,vk_00,device_00,(VkCommandPool)pipelineBuilder._192_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_6d0,(Move *)&local_6f0);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_6d0.deleter.m_deviceIface;
  data_07.object = local_6d0.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_6d0.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_6d0.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_6d0.deleter.m_device >> 0x20);
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_6d0.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_6d0.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_6b0,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_6f0);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_7c0);
  pGVar14 = GraphicsPipelineBuilder::setRenderSize
                      ((GraphicsPipelineBuilder *)local_7c0,(IVec2 *)&stack0xffffffffffffffb8);
  pPVar15 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"vert",&local_7e1);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar15,&local_7e0);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar16,
                       (VkSpecializationInfo *)
                       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                       m_allocator);
  pPVar15 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"frag",&local_809);
  pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar15,&local_808);
  GraphicsPipelineBuilder::setShader
            (pGVar14,vk_00,device_00,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar16,
             (VkSpecializationInfo *)
             renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  if ((this->m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) ||
     (this->m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)) {
    pPVar15 = Context::getBinaryCollection((this->super_TestInstance).m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"tesc",&local_831);
    pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar15,&local_830);
    pGVar14 = GraphicsPipelineBuilder::setShader
                        ((GraphicsPipelineBuilder *)local_7c0,vk_00,device_00,
                         VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar16,
                         (VkSpecializationInfo *)
                         renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                         m_allocator);
    pPVar15 = Context::getBinaryCollection((this->super_TestInstance).m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_858,"tese",&local_859);
    pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar15,&local_858);
    GraphicsPipelineBuilder::setShader
              (pGVar14,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar16,
               (VkSpecializationInfo *)
               renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator)
    ;
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator(&local_859);
    std::__cxx11::string::~string((string *)&local_830);
    std::allocator<char>::~allocator(&local_831);
  }
  if (this->m_stage == VK_SHADER_STAGE_GEOMETRY_BIT) {
    pPVar15 = Context::getBinaryCollection((this->super_TestInstance).m_context);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_880,"geom",
               (allocator<char> *)
               ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator + 7));
    pPVar16 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar15,&local_880);
    GraphicsPipelineBuilder::setShader
              ((GraphicsPipelineBuilder *)local_7c0,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,
               pPVar16,(VkSpecializationInfo *)
                       renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                       m_allocator);
    std::__cxx11::string::~string((string *)&local_880);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                       m_allocator + 7));
  }
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_5e8);
  pipelineLayout_00.m_internal = pHVar17->m_internal;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_520);
  GraphicsPipelineBuilder::build
            (&local_8e8,(GraphicsPipelineBuilder *)local_7c0,vk_00,device_00,pipelineLayout_00,
             (VkRenderPass)pHVar12->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_8c8,(Move *)&local_8e8);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_8c8.deleter.m_deviceIface;
  data_08.object.m_internal = local_8c8.object.m_internal;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_8c8.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device._0_4_ = (int)local_8c8.deleter.m_device;
  data_08.deleter.m_device._4_4_ = (int)((ulong)local_8c8.deleter.m_device >> 0x20);
  data_08.deleter.m_allocator._0_4_ = (int)local_8c8.deleter.m_allocator;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_8c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_8a8,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_8e8);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  dVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xffffffffffffffb8);
  dVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xffffffffffffffb8);
  ::vk::makeExtent2D(dVar4,dVar5);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&vertexBufferOffset,0.0,0.0,0.0,1.0);
  imageFullSubresourceRange.baseArrayLayer = 0;
  imageFullSubresourceRange.layerCount = 0;
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  beginCommandBuffer(vk_00,*ppVVar18);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&barrierColorAttachmentSetInitialLayout.field_0x44,1,0,1,0,1
            );
  pVVar6 = pipeline::Image::operator*((Image *)local_80);
  subresourceRange_00.levelCount = imageFullSubresourceRange.aspectMask;
  subresourceRange_00.aspectMask = barrierColorAttachmentSetInitialLayout._68_4_;
  subresourceRange_00.baseMipLevel = uStack_930;
  subresourceRange_00.baseArrayLayer = imageFullSubresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = imageFullSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_980,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar6->m_internal,
             subresourceRange_00);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar18,0x4000,0x400,0,0,0,0,0,1,local_980);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  commandBuffer = *ppVVar18;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_520);
  renderPass_00.m_internal = pHVar12->m_internal;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_580);
  beginRenderPass(vk_00,commandBuffer,renderPass_00,(VkFramebuffer)pHVar19->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)&vertexBufferOffset);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  pVVar1 = *ppVVar18;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_8a8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,0,pHVar20->m_internal);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  pVVar1 = *ppVVar18;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_5e8);
  shaderWriteBarrier.size = pHVar17->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3e0);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar1,0,shaderWriteBarrier.size,0,1,(int)pHVar11,0,0)
  ;
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  pVVar1 = *ppVVar18;
  pVVar10 = pipeline::Buffer::get((Buffer *)local_1a8);
  (*vk_00->_vptr_DeviceInterface[0x58])
            (vk_00,pVVar1,0,1,pVVar10,&imageFullSubresourceRange.baseArrayLayer);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar18,3,1,0);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar18);
  pVVar10 = pipeline::Buffer::operator*((Buffer *)local_260);
  resultAlloc = (Allocation *)pVVar10->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_a00,0x40,0x2000,(VkBuffer)resultAlloc,0,this->m_ssboSize
            );
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar18,0x8000,0x4000,0,0,0,1,(int)local_a00,0,0);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  result = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar18);
  ::vk::checkResult(result,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineSpecConstantTests.cpp"
                    ,0x2ad);
  ppVVar18 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_6b0);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar18);
  local_a10 = pipeline::Buffer::getAllocation((Buffer *)local_260);
  local_a18 = ::vk::Allocation::getMemory(local_a10);
  VVar7 = ::vk::Allocation::getOffset(local_a10);
  ::vk::invalidateMappedMemoryRange(vk_00,device_00,local_a18,VVar7,this->m_ssboSize);
  this_03 = Context::getTestContext((this->super_TestInstance).m_context);
  log = tcu::TestContext::getLog(this_03);
  memory = ::vk::Allocation::getHostPtr(local_a10);
  bVar3 = verifyValues(log,memory,&this->m_expectedValues);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"Success",&local_a39);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_a38);
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator(&local_a39);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a60,"Values did not match",&local_a61);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::allocator<char>::~allocator(&local_a61);
  }
  local_a40 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_8a8);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)local_7c0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_6b0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_650);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_5e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_580);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_520);
  Specialization::~Specialization((Specialization *)&pSpecInfo);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_368);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2c0);
  pipeline::Buffer::~Buffer((Buffer *)local_260);
  pipeline::Buffer::~Buffer((Buffer *)local_1a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_100);
  pipeline::Image::~Image((Image *)local_80);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicsTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2          renderSize    = tcu::IVec2(32, 32);
	const VkFormat            imageFormat   = VK_FORMAT_R8G8B8A8_UNORM;
	const Image               colorImage    (vk, device, allocator, makeImageCreateInfo(renderSize, imageFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT), MemoryRequirement::Any);
	const Unique<VkImageView> colorImageView(makeImageView(vk, device, *colorImage, VK_IMAGE_VIEW_TYPE_2D, imageFormat, makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)));

	// Vertex buffer

	const deUint32     numVertices           = 3;
	const VkDeviceSize vertexBufferSizeBytes = sizeof(tcu::Vec4) * numVertices;
	const Buffer       vertexBuffer          (vk, device, allocator, makeBufferCreateInfo(vertexBufferSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		tcu::Vec4* pVertices = reinterpret_cast<tcu::Vec4*>(alloc.getHostPtr());

		pVertices[0] = tcu::Vec4(-1.0f, -1.0f,  0.0f,  1.0f);
		pVertices[1] = tcu::Vec4(-1.0f,  1.0f,  0.0f,  1.0f);
		pVertices[2] = tcu::Vec4( 1.0f, -1.0f,  0.0f,  1.0f);

		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexBufferSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Descriptors

	const Buffer resultBuffer(vk, device, allocator, makeBufferCreateInfo(m_ssboSize, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_ALL_GRAPHICS)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet        (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  descriptorBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, m_ssboSize);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	// Specialization

	const Specialization        specialization (m_specConstants);
	const VkSpecializationInfo* pSpecInfo      = specialization.getSpecializationInfo();

	// Pipeline

	const Unique<VkRenderPass>     renderPass    (makeRenderPass    (vk, device, imageFormat));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebuffer	(vk, device, *renderPass, 1u, &colorImageView.get(), static_cast<deUint32>(renderSize.x()), static_cast<deUint32>(renderSize.y())));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (createCommandPool (vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (makeCommandBuffer (vk, device, *cmdPool));

	GraphicsPipelineBuilder pipelineBuilder;
	pipelineBuilder
		.setRenderSize(renderSize)
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,   m_context.getBinaryCollection().get("vert"), pSpecInfo)
		.setShader(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT, m_context.getBinaryCollection().get("frag"), pSpecInfo);

	if ((m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) || (m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT))
		pipelineBuilder
			.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,    m_context.getBinaryCollection().get("tesc"), pSpecInfo)
			.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), pSpecInfo);

	if (m_stage == VK_SHADER_STAGE_GEOMETRY_BIT)
		pipelineBuilder
			.setShader(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT, m_context.getBinaryCollection().get("geom"), pSpecInfo);

	const Unique<VkPipeline> pipeline (pipelineBuilder.build(vk, device, *pipelineLayout, *renderPass));

	// Draw commands

	const VkRect2D renderArea = {
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};
	const tcu::Vec4    clearColor         (0.0f, 0.0f, 0.0f, 1.0f);
	const VkDeviceSize vertexBufferOffset = 0ull;

	beginCommandBuffer(vk, *cmdBuffer);

	{
		const VkImageSubresourceRange imageFullSubresourceRange              = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
		const VkImageMemoryBarrier    barrierColorAttachmentSetInitialLayout = makeImageMemoryBarrier(
			0u, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorImage, imageFullSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &barrierColorAttachmentSetInitialLayout);
	}

	beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);

	vk.cmdBindPipeline      (*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	vk.cmdBindVertexBuffers (*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);

	vk.cmdDraw(*cmdBuffer, numVertices, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, m_ssboSize);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results

	const Allocation& resultAlloc = resultBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), m_ssboSize);

	if (verifyValues(m_context.getTestContext().getLog(), resultAlloc.getHostPtr(), m_expectedValues))
		return tcu::TestStatus::pass("Success");
	else
		return tcu::TestStatus::fail("Values did not match");
}